

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_async_notification_signal(ma_async_notification *pNotification)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if (pNotification != (ma_async_notification *)0x0) {
    if (*pNotification == (code *)0x0) {
      mVar1 = MA_NOT_IMPLEMENTED;
    }
    else {
      (**pNotification)();
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_async_notification_signal(ma_async_notification* pNotification)
{
    ma_async_notification_callbacks* pNotificationCallbacks = (ma_async_notification_callbacks*)pNotification;

    if (pNotification == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pNotificationCallbacks->onSignal == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    pNotificationCallbacks->onSignal(pNotification);
    return MA_INVALID_ARGS;
}